

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bson_parser.hpp
# Opt level: O2

void __thiscall
jsoncons::bson::basic_bson_parser<jsoncons::bytes_source,_std::allocator<char>_>::read_value
          (basic_bson_parser<jsoncons::bytes_source,_std::allocator<char>_> *this,
          json_visitor *visitor,uint8_t type,error_code *ec)

{
  size_t *psVar1;
  string_type *buffer;
  char *first;
  pointer ppVar2;
  pointer puVar3;
  value_type *pvVar4;
  int iVar5;
  bson_errc __e;
  size_t sVar6;
  byte bVar7;
  type_conflict2 tVar8;
  _func_int **pp_Var9;
  undefined7 in_register_00000011;
  size_t length;
  size_t length_00;
  undefined8 uVar10;
  ulong uVar11;
  size_t sVar12;
  size_t sVar13;
  oid_t *poVar14;
  value_type *pvVar15;
  size_t len;
  type tVar16;
  decimal128_to_chars_result dVar17;
  undefined8 uStack_80;
  uint8_t buf [8];
  uint8_t subtype;
  uint8_t uStack_67;
  uint8_t uStack_66;
  uint8_t uStack_65;
  uint8_t uStack_64;
  uint8_t uStack_63;
  uint8_t uStack_62;
  uint8_t uStack_61;
  undefined4 uStack_60;
  value_type *local_58;
  size_t local_50;
  pointer local_48;
  oid_t oid;
  undefined4 uStack_34;
  
  poVar14 = (oid_t *)buf;
  iVar5 = (int)CONCAT71(in_register_00000011,type);
  switch(iVar5) {
  case 1:
    pvVar15 = (this->source_).current_;
    uVar11 = (long)(this->source_).end_ - (long)pvVar15;
    sVar12 = 8;
    if (uVar11 < 8) {
      sVar12 = uVar11;
    }
    memcpy(buf,pvVar15,sVar12);
    (this->source_).current_ = pvVar15 + sVar12;
    psVar1 = &(this->state_stack_).
              super__Vector_base<jsoncons::bson::parse_state,_std::allocator<jsoncons::bson::parse_state>_>
              ._M_impl.super__Vector_impl_data._M_finish[-1].pos;
    *psVar1 = *psVar1 + sVar12;
    if (7 < uVar11) {
      (*visitor->_vptr_basic_json_visitor[0x12])(buf._0_4_,visitor,0,this,ec);
LAB_001a10c6:
      bVar7 = this->cursor_mode_ ^ 1;
      goto LAB_001a10cb;
    }
    break;
  case 3:
    begin_document(this,visitor,ec);
    return;
  case 4:
    begin_array(this,visitor,ec);
    return;
  case 5:
    pvVar15 = (this->source_).current_;
    local_58 = (this->source_).end_;
    uVar11 = (long)local_58 - (long)pvVar15;
    sVar12 = 4;
    if (uVar11 < 4) {
      sVar12 = uVar11;
    }
    memcpy(buf,pvVar15,sVar12);
    pvVar15 = pvVar15 + sVar12;
    (this->source_).current_ = pvVar15;
    ppVar2 = (this->state_stack_).
             super__Vector_base<jsoncons::bson::parse_state,_std::allocator<jsoncons::bson::parse_state>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    sVar13 = sVar12 + ppVar2[-1].pos;
    ppVar2[-1].pos = sVar13;
    if (uVar11 < 4) {
      __e = unexpected_eof;
      goto LAB_001a0bad;
    }
    local_50 = (size_t)(int)buf._0_4_;
    local_48 = ppVar2;
    if ((long)local_50 < 0) {
      __e = length_is_negative;
      goto LAB_001a0bad;
    }
    uVar11 = (ulong)(local_58 != pvVar15);
    memcpy(&subtype,pvVar15,uVar11);
    sVar6 = local_50;
    (this->source_).current_ = pvVar15 + uVar11;
    local_48[-1].pos = sVar13 + uVar11;
    if (local_58 != pvVar15) {
      puVar3 = (this->bytes_buffer_).
               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_start;
      if ((this->bytes_buffer_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
          _M_impl.super__Vector_impl_data._M_finish != puVar3) {
        (this->bytes_buffer_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
        _M_impl.super__Vector_impl_data._M_finish = puVar3;
      }
      tVar8 = source_reader<jsoncons::bytes_source>::
              read<std::vector<unsigned_char,std::allocator<unsigned_char>>>
                        (&this->source_,&this->bytes_buffer_,local_50);
      psVar1 = &(this->state_stack_).
                super__Vector_base<jsoncons::bson::parse_state,_std::allocator<jsoncons::bson::parse_state>_>
                ._M_impl.super__Vector_impl_data._M_finish[-1].pos;
      *psVar1 = *psVar1 + tVar8;
      if (tVar8 == sVar6) {
        basic_json_visitor<char>::
        byte_string_value<std::vector<unsigned_char,std::allocator<unsigned_char>>>
                  (visitor,&this->bytes_buffer_,(ulong)_subtype & 0xff,&this->super_ser_context,ec,0
                  );
        goto LAB_001a10c6;
      }
    }
    break;
  case 6:
    pp_Var9 = visitor->_vptr_basic_json_visitor;
    uVar10 = 0xd;
    goto LAB_001a1003;
  case 7:
    pvVar15 = (this->source_).current_;
    uVar11 = (long)(this->source_).end_ - (long)pvVar15;
    sVar12 = 0xc;
    if (uVar11 < 0xc) {
      sVar12 = uVar11;
    }
    memcpy(&subtype,pvVar15,sVar12);
    (this->source_).current_ = pvVar15 + sVar12;
    psVar1 = &(this->state_stack_).
              super__Vector_base<jsoncons::bson::parse_state,_std::allocator<jsoncons::bson::parse_state>_>
              ._M_impl.super__Vector_impl_data._M_finish[-1].pos;
    *psVar1 = *psVar1 + sVar12;
    if (0xb < uVar11) {
      stack0xffffffffffffffc8 = (pointer)CONCAT44(uStack_34,uStack_60);
      oid.bytes_._M_elems[0] = subtype;
      oid.bytes_._M_elems[1] = uStack_67;
      oid.bytes_._M_elems[2] = uStack_66;
      oid.bytes_._M_elems[3] = uStack_65;
      oid.bytes_._M_elems[4] = uStack_64;
      oid.bytes_._M_elems[5] = uStack_63;
      oid.bytes_._M_elems[6] = uStack_62;
      oid.bytes_._M_elems[7] = uStack_61;
      to_string<std::__cxx11::string>(&oid,&this->text_buffer_);
      buf = (uint8_t  [8])(this->text_buffer_)._M_string_length;
      pp_Var9 = visitor->_vptr_basic_json_visitor;
      uStack_80 = 0x13;
LAB_001a0f82:
      (*pp_Var9[0xc])(visitor,poVar14,uStack_80,this,ec);
      goto LAB_001a10c6;
    }
    break;
  case 8:
    pvVar15 = (this->source_).current_;
    pvVar4 = (this->source_).end_;
    uVar11 = (ulong)(pvVar4 != pvVar15);
    memcpy(buf,pvVar15,uVar11);
    (this->source_).current_ = pvVar15 + uVar11;
    psVar1 = &(this->state_stack_).
              super__Vector_base<jsoncons::bson::parse_state,_std::allocator<jsoncons::bson::parse_state>_>
              ._M_impl.super__Vector_impl_data._M_finish[-1].pos;
    *psVar1 = *psVar1 + uVar11;
    if (pvVar4 != pvVar15) {
      (*visitor->_vptr_basic_json_visitor[0xb])(visitor,(ulong)(buf[0] != '\0'),0,this,ec);
      goto LAB_001a10c6;
    }
    break;
  case 9:
    pvVar15 = (this->source_).current_;
    uVar11 = (long)(this->source_).end_ - (long)pvVar15;
    sVar12 = 8;
    if (uVar11 < 8) {
      sVar12 = uVar11;
    }
    memcpy(buf,pvVar15,sVar12);
    (this->source_).current_ = pvVar15 + sVar12;
    psVar1 = &(this->state_stack_).
              super__Vector_base<jsoncons::bson::parse_state,_std::allocator<jsoncons::bson::parse_state>_>
              ._M_impl.super__Vector_impl_data._M_finish[-1].pos;
    *psVar1 = *psVar1 + sVar12;
    if (7 < uVar11) {
      pp_Var9 = visitor->_vptr_basic_json_visitor;
      uVar10 = 6;
LAB_001a1066:
      (*pp_Var9[0x10])(visitor,buf,uVar10,this,ec);
      goto LAB_001a10c6;
    }
    break;
  case 10:
    pp_Var9 = visitor->_vptr_basic_json_visitor;
    uVar10 = 0;
LAB_001a1003:
    (*pp_Var9[10])(visitor,uVar10,this,ec);
    goto LAB_001a100c;
  case 0xb:
    (this->text_buffer_)._M_string_length = 0;
    buffer = &this->text_buffer_;
    *(this->text_buffer_)._M_dataplus._M_p = '\0';
    std::__cxx11::string::push_back((char)buffer);
    read_cstring(this,buffer,ec);
    if (ec->_M_value != 0) {
      return;
    }
    std::__cxx11::string::push_back((char)buffer);
    read_cstring(this,buffer,ec);
    if (ec->_M_value != 0) {
      return;
    }
    buf = (uint8_t  [8])(this->text_buffer_)._M_string_length;
    pp_Var9 = visitor->_vptr_basic_json_visitor;
    uStack_80 = 0x14;
    goto LAB_001a0deb;
  case 0xc:
  case 0xf:
switchD_001a0adb_caseD_c:
    __e = unknown_type;
    goto LAB_001a0bad;
  case 0xd:
    (this->text_buffer_)._M_string_length = 0;
    *(this->text_buffer_)._M_dataplus._M_p = '\0';
    read_string(this,&this->text_buffer_,ec);
    if (ec->_M_value != 0) {
      return;
    }
    tVar16 = unicode_traits::validate<char>
                       ((unicode_traits *)(this->text_buffer_)._M_dataplus._M_p,
                        (char *)(this->text_buffer_)._M_string_length,length_00);
    if (tVar16.ec == success) {
      buf = (uint8_t  [8])(this->text_buffer_)._M_string_length;
      pp_Var9 = visitor->_vptr_basic_json_visitor;
      uStack_80 = 0x15;
      goto LAB_001a0deb;
    }
    goto LAB_001a10ec;
  case 0x10:
    pvVar15 = (this->source_).current_;
    uVar11 = (long)(this->source_).end_ - (long)pvVar15;
    sVar12 = 4;
    if (uVar11 < 4) {
      sVar12 = uVar11;
    }
    memcpy(buf,pvVar15,sVar12);
    (this->source_).current_ = pvVar15 + sVar12;
    psVar1 = &(this->state_stack_).
              super__Vector_base<jsoncons::bson::parse_state,_std::allocator<jsoncons::bson::parse_state>_>
              ._M_impl.super__Vector_impl_data._M_finish[-1].pos;
    *psVar1 = *psVar1 + sVar12;
    if (3 < uVar11) {
      buf = (uint8_t  [8])(long)(int)buf._0_4_;
LAB_001a105e:
      pp_Var9 = visitor->_vptr_basic_json_visitor;
      uVar10 = 0;
      goto LAB_001a1066;
    }
    break;
  case 0x11:
    pvVar15 = (this->source_).current_;
    uVar11 = (long)(this->source_).end_ - (long)pvVar15;
    sVar12 = 8;
    if (uVar11 < 8) {
      sVar12 = uVar11;
    }
    memcpy(buf,pvVar15,sVar12);
    (this->source_).current_ = pvVar15 + sVar12;
    psVar1 = &(this->state_stack_).
              super__Vector_base<jsoncons::bson::parse_state,_std::allocator<jsoncons::bson::parse_state>_>
              ._M_impl.super__Vector_impl_data._M_finish[-1].pos;
    *psVar1 = *psVar1 + sVar12;
    if (7 < uVar11) {
      (*visitor->_vptr_basic_json_visitor[0xf])(visitor,buf,0,this,ec);
      goto LAB_001a10c6;
    }
    break;
  case 0x12:
    pvVar15 = (this->source_).current_;
    uVar11 = (long)(this->source_).end_ - (long)pvVar15;
    sVar12 = 8;
    if (uVar11 < 8) {
      sVar12 = uVar11;
    }
    memcpy(buf,pvVar15,sVar12);
    (this->source_).current_ = pvVar15 + sVar12;
    psVar1 = &(this->state_stack_).
              super__Vector_base<jsoncons::bson::parse_state,_std::allocator<jsoncons::bson::parse_state>_>
              ._M_impl.super__Vector_impl_data._M_finish[-1].pos;
    *psVar1 = *psVar1 + sVar12;
    if (7 < uVar11) goto LAB_001a105e;
    break;
  case 0x13:
    pvVar15 = (this->source_).current_;
    uVar11 = (long)(this->source_).end_ - (long)pvVar15;
    sVar12 = 0x10;
    if (uVar11 < 0x10) {
      sVar12 = uVar11;
    }
    memcpy(buf,pvVar15,sVar12);
    (this->source_).current_ = pvVar15 + sVar12;
    psVar1 = &(this->state_stack_).
              super__Vector_base<jsoncons::bson::parse_state,_std::allocator<jsoncons::bson::parse_state>_>
              ._M_impl.super__Vector_impl_data._M_finish[-1].pos;
    *psVar1 = *psVar1 + sVar12;
    if (0xf < uVar11) {
      subtype = buf[0];
      uStack_67 = buf[1];
      uStack_66 = buf[2];
      uStack_65 = buf[3];
      uStack_64 = buf[4];
      uStack_63 = buf[5];
      uStack_62 = buf[6];
      uStack_61 = buf[7];
      (this->text_buffer_)._M_string_length = 0;
      *(this->text_buffer_)._M_dataplus._M_p = '\0';
      std::__cxx11::string::resize((ulong)&this->text_buffer_);
      first = (this->text_buffer_)._M_dataplus._M_p;
      dVar17 = decimal128_to_chars(first,first + (this->text_buffer_)._M_string_length,
                                   (decimal128_t *)&subtype);
      unique0x00012000 = (this->text_buffer_)._M_dataplus._M_p;
      oid.bytes_._M_elems._0_8_ = (long)dVar17.ptr - (long)unique0x00012000;
      poVar14 = &oid;
      pp_Var9 = visitor->_vptr_basic_json_visitor;
      uStack_80 = 0xb;
      goto LAB_001a0f82;
    }
    break;
  default:
    if ((iVar5 != 0x7f) && (iVar5 != 0xff)) goto switchD_001a0adb_caseD_c;
  case 2:
  case 0xe:
    (this->text_buffer_)._M_string_length = 0;
    *(this->text_buffer_)._M_dataplus._M_p = '\0';
    read_string(this,&this->text_buffer_,ec);
    if (ec->_M_value != 0) {
      return;
    }
    tVar16 = unicode_traits::validate<char>
                       ((unicode_traits *)(this->text_buffer_)._M_dataplus._M_p,
                        (char *)(this->text_buffer_)._M_string_length,length);
    if (tVar16.ec != success) {
LAB_001a10ec:
      __e = invalid_utf8_text_string;
LAB_001a0bad:
      std::error_code::operator=(ec,__e);
      this->more_ = false;
      return;
    }
    buf = (uint8_t  [8])(this->text_buffer_)._M_string_length;
    pp_Var9 = visitor->_vptr_basic_json_visitor;
    uStack_80 = 0;
LAB_001a0deb:
    (*pp_Var9[0xc])(visitor,buf,uStack_80,this,ec);
LAB_001a100c:
    this->more_ = (bool)(this->cursor_mode_ ^ 1);
    return;
  }
  std::error_code::operator=(ec,unexpected_eof);
  bVar7 = false;
LAB_001a10cb:
  this->more_ = (bool)bVar7;
  return;
}

Assistant:

void read_value(json_visitor& visitor, uint8_t type, std::error_code& ec)
    {
        switch (type)
        {
            case jsoncons::bson::bson_type::double_type:
            {
                uint8_t buf[sizeof(double)]; 
                std::size_t n = source_.read(buf, sizeof(double));
                state_stack_.back().pos += n;
                if (JSONCONS_UNLIKELY(n != sizeof(double)))
                {
                    ec = bson_errc::unexpected_eof;
                    more_ = false;
                    return;
                }
                double res = binary::little_to_native<double>(buf, sizeof(buf));
                visitor.double_value(res, semantic_tag::none, *this, ec);
                more_ = !cursor_mode_;
                break;
            }
            case jsoncons::bson::bson_type::symbol_type:
            case jsoncons::bson::bson_type::min_key_type:
            case jsoncons::bson::bson_type::max_key_type:
            case jsoncons::bson::bson_type::string_type:
            {
                text_buffer_.clear();
                read_string(text_buffer_, ec);
                if (JSONCONS_UNLIKELY(ec))
                {
                    return;
                }
                auto result = unicode_traits::validate(text_buffer_.data(), text_buffer_.size());
                if (JSONCONS_UNLIKELY(result.ec != unicode_traits::conv_errc()))
                {
                    ec = bson_errc::invalid_utf8_text_string;
                    more_ = false;
                    return;
                }
                visitor.string_value(text_buffer_, semantic_tag::none, *this, ec);
                more_ = !cursor_mode_;
                break;
            }
            case jsoncons::bson::bson_type::javascript_type:
            {
                text_buffer_.clear();
                read_string(text_buffer_, ec);
                if (JSONCONS_UNLIKELY(ec))
                {
                    return;
                }
                auto result = unicode_traits::validate(text_buffer_.data(), text_buffer_.size());
                if (JSONCONS_UNLIKELY(result.ec != unicode_traits::conv_errc()))
                {
                    ec = bson_errc::invalid_utf8_text_string;
                    more_ = false;
                    return;
                }
                visitor.string_value(text_buffer_, semantic_tag::code, *this, ec);
                more_ = !cursor_mode_;
                break;
            }
            case jsoncons::bson::bson_type::regex_type:
            {
                text_buffer_.clear();
                text_buffer_.push_back('/');
                read_cstring(text_buffer_, ec);
                if (JSONCONS_UNLIKELY(ec))
                {
                    return;
                }
                text_buffer_.push_back('/');
                read_cstring(text_buffer_, ec);
                if (JSONCONS_UNLIKELY(ec))
                {
                    return;
                }
                visitor.string_value(text_buffer_, semantic_tag::regex, *this, ec);
                more_ = !cursor_mode_;
                break;
            }
            case jsoncons::bson::bson_type::document_type: 
            {
                begin_document(visitor,ec);
                break;
            }

            case jsoncons::bson::bson_type::array_type: 
            {
                begin_array(visitor,ec);
                break;
            }
            case jsoncons::bson::bson_type::undefined_type: 
                {
                    visitor.null_value(semantic_tag::undefined, *this, ec);
                    more_ = !cursor_mode_;
                    break;
                }
            case jsoncons::bson::bson_type::null_type: 
            {
                visitor.null_value(semantic_tag::none, *this, ec);
                more_ = !cursor_mode_;
                break;
            }
            case jsoncons::bson::bson_type::bool_type:
            {
                uint8_t c;
                std::size_t n = source_.read(&c, 1);
                state_stack_.back().pos += n;
                if (JSONCONS_UNLIKELY(n != 1))
                {
                    ec = bson_errc::unexpected_eof;
                    more_ = false;
                    return;
                }
                visitor.bool_value(c != 0, semantic_tag::none, *this, ec);
                more_ = !cursor_mode_;
                break;
            }
            case jsoncons::bson::bson_type::int32_type: 
            {
                uint8_t buf[sizeof(int32_t)]; 
                std::size_t n = source_.read(buf, sizeof(int32_t));
                state_stack_.back().pos += n;
                if (JSONCONS_UNLIKELY(n != sizeof(int32_t)))
                {
                    ec = bson_errc::unexpected_eof;
                    more_ = false;
                    return;
                }
                auto val = binary::little_to_native<int32_t>(buf, sizeof(buf));
                visitor.int64_value(val, semantic_tag::none, *this, ec);
                more_ = !cursor_mode_;
                break;
            }

            case jsoncons::bson::bson_type::timestamp_type: 
            {
                uint8_t buf[sizeof(uint64_t)]; 
                std::size_t n = source_.read(buf, sizeof(uint64_t));
                state_stack_.back().pos += n;
                if (JSONCONS_UNLIKELY(n != sizeof(uint64_t)))
                {
                    ec = bson_errc::unexpected_eof;
                    more_ = false;
                    return;
                }
                auto val = binary::little_to_native<uint64_t>(buf, sizeof(buf));
                visitor.uint64_value(val, semantic_tag::none, *this, ec);
                more_ = !cursor_mode_;
                break;
            }

            case jsoncons::bson::bson_type::int64_type: 
            {
                uint8_t buf[sizeof(int64_t)]; 
                std::size_t n = source_.read(buf, sizeof(int64_t));
                state_stack_.back().pos += n;
                if (JSONCONS_UNLIKELY(n != sizeof(int64_t)))
                {
                    ec = bson_errc::unexpected_eof;
                    more_ = false;
                    return;
                }
                auto val = binary::little_to_native<int64_t>(buf, sizeof(buf));
                visitor.int64_value(val, semantic_tag::none, *this, ec);
                more_ = !cursor_mode_;
                break;
            }

            case jsoncons::bson::bson_type::datetime_type: 
            {
                uint8_t buf[sizeof(int64_t)]; 
                std::size_t n = source_.read(buf, sizeof(int64_t));
                state_stack_.back().pos += n;
                if (JSONCONS_UNLIKELY(n != sizeof(int64_t)))
                {
                    ec = bson_errc::unexpected_eof;
                    more_ = false;
                    return;
                }
                auto val = binary::little_to_native<int64_t>(buf, sizeof(buf));
                visitor.int64_value(val, semantic_tag::epoch_milli, *this, ec);
                more_ = !cursor_mode_;
                break;
            }
            case jsoncons::bson::bson_type::binary_type: 
            {
                uint8_t buf[sizeof(int32_t)]; 
                std::size_t n = source_.read(buf, sizeof(int32_t));
                state_stack_.back().pos += n;
                if (JSONCONS_UNLIKELY(n != sizeof(int32_t)))
                {
                    ec = bson_errc::unexpected_eof;
                    more_ = false;
                    return;
                }
                const auto len = binary::little_to_native<int32_t>(buf, sizeof(buf));
                if (JSONCONS_UNLIKELY(len < 0))
                {
                    ec = bson_errc::length_is_negative;
                    more_ = false;
                    return;
                }
                uint8_t subtype;
                n = source_.read(&subtype, 1);
                state_stack_.back().pos += n;
                if (JSONCONS_UNLIKELY(n != 1))
                {
                    ec = bson_errc::unexpected_eof;
                    more_ = false;
                    return;
                }

                bytes_buffer_.clear();
                n = source_reader<Source>::read(source_, bytes_buffer_, len);
                state_stack_.back().pos += n;
                if (JSONCONS_UNLIKELY(n != static_cast<std::size_t>(len)))
                {
                    ec = bson_errc::unexpected_eof;
                    more_ = false;
                    return;
                }

                visitor.byte_string_value(bytes_buffer_, 
                                                  subtype, 
                                                  *this,
                                                  ec);
                more_ = !cursor_mode_;
                break;
            }
            case jsoncons::bson::bson_type::decimal128_type: 
            {
                uint8_t buf[sizeof(uint64_t)*2]; 
                std::size_t n = source_.read(buf, sizeof(buf));
                state_stack_.back().pos += n;
                if (JSONCONS_UNLIKELY(n != sizeof(buf)))
                {
                    ec = bson_errc::unexpected_eof;
                    more_ = false;
                    return;
                }

                decimal128_t dec;
                dec.low = binary::little_to_native<uint64_t>(buf, sizeof(uint64_t));
                dec.high = binary::little_to_native<uint64_t>(buf+sizeof(uint64_t), sizeof(uint64_t));

                text_buffer_.clear();
                text_buffer_.resize(bson::decimal128_limits::buf_size);
                auto r = bson::decimal128_to_chars(&text_buffer_[0], &text_buffer_[0]+text_buffer_.size(), dec);
                visitor.string_value(string_view(text_buffer_.data(),static_cast<std::size_t>(r.ptr-text_buffer_.data())), semantic_tag::float128, *this, ec);
                more_ = !cursor_mode_;
                break;
            }
            case jsoncons::bson::bson_type::object_id_type: 
            {
                uint8_t buf[12]; 
                std::size_t n = source_.read(buf, sizeof(buf));
                state_stack_.back().pos += n;
                if (JSONCONS_UNLIKELY(n != sizeof(buf)))
                {
                    ec = bson_errc::unexpected_eof;
                    more_ = false;
                    return;
                }

                oid_t oid(buf);
                to_string(oid, text_buffer_);

                visitor.string_value(text_buffer_, semantic_tag::id, *this, ec);
                more_ = !cursor_mode_;
                break;
            }
            default:
            {
                ec = bson_errc::unknown_type;
                more_ = false;
                return;
            }
        }
    }